

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,int64_t subscriptionId)

{
  int64_t local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &local_30;
  local_10 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:194:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:194:9)>
             ::_M_manager;
  local_30 = subscriptionId;
  local_28._M_unused._M_object = this;
  callAndPollForResponse(this,(function<bool_(long)> *)&local_28,"stop recording");
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void AeronArchive::stopRecording(std::int64_t subscriptionId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopRecording(subscriptionId, correlationId, controlSessionId_);
        },
        "stop recording");
}